

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.h
# Opt level: O0

BLOCK_SIZE dim_to_size(int dim)

{
  int dim_local;
  undefined1 local_1;
  
  if (dim == 4) {
    local_1 = BLOCK_4X4;
  }
  else if (dim == 8) {
    local_1 = BLOCK_8X8;
  }
  else if (dim == 0x10) {
    local_1 = BLOCK_16X16;
  }
  else if (dim == 0x20) {
    local_1 = BLOCK_32X32;
  }
  else if (dim == 0x40) {
    local_1 = BLOCK_64X64;
  }
  else if (dim == 0x80) {
    local_1 = BLOCK_128X128;
  }
  else {
    local_1 = BLOCK_4X4;
  }
  return local_1;
}

Assistant:

static BLOCK_SIZE dim_to_size(int dim) {
  switch (dim) {
    case 4: return BLOCK_4X4;
    case 8: return BLOCK_8X8;
    case 16: return BLOCK_16X16;
    case 32: return BLOCK_32X32;
    case 64: return BLOCK_64X64;
    case 128: return BLOCK_128X128;
    default: assert(0); return 0;
  }
}